

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ArrayColumnData::Append
          (ArrayColumnData *this,BaseStatistics *stats,ColumnAppendState *state,Vector *vector,
          idx_t count)

{
  atomic<unsigned_long> *paVar1;
  reference pvVar2;
  idx_t iVar3;
  Vector *pVVar4;
  pointer pCVar5;
  BaseStatistics *pBVar6;
  Vector append_vector;
  
  if (vector->vector_type == FLAT_VECTOR) {
    pvVar2 = vector<duckdb::ColumnAppendState,_true>::get<true>(&state->child_appends,0);
    ColumnData::Append(&(this->validity).super_ColumnData,stats,pvVar2,vector,count);
    iVar3 = ArrayType::GetSize(&(this->super_ColumnData).type);
    pVVar4 = ArrayVector::GetEntry(vector);
    pCVar5 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(&this->child_column);
    pBVar6 = ArrayStats::GetChildStats(stats);
    pvVar2 = vector<duckdb::ColumnAppendState,_true>::get<true>(&state->child_appends,1);
    (*pCVar5->_vptr_ColumnData[0x12])(pCVar5,pBVar6,pvVar2,pVVar4,iVar3 * count);
    LOCK();
    paVar1 = &(this->super_ColumnData).count;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
    UNLOCK();
  }
  else {
    Vector::Vector(&append_vector,vector);
    Vector::Flatten(&append_vector,count);
    (*(this->super_ColumnData)._vptr_ColumnData[0x12])(this,stats,state,&append_vector,count);
    Vector::~Vector(&append_vector);
  }
  return;
}

Assistant:

void ArrayColumnData::Append(BaseStatistics &stats, ColumnAppendState &state, Vector &vector, idx_t count) {
	if (vector.GetVectorType() != VectorType::FLAT_VECTOR) {
		Vector append_vector(vector);
		append_vector.Flatten(count);
		Append(stats, state, append_vector, count);
		return;
	}

	// Append validity
	validity.Append(stats, state.child_appends[0], vector, count);
	// Append child column
	auto array_size = ArrayType::GetSize(type);
	auto &child_vec = ArrayVector::GetEntry(vector);
	child_column->Append(ArrayStats::GetChildStats(stats), state.child_appends[1], child_vec, count * array_size);

	this->count += count;
}